

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O1

int lex_skipeq(LexState *ls)

{
  uint uVar1;
  LexChar LVar2;
  byte *pbVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  
  uVar1 = ls->c;
  uVar6 = 0xffffffff;
  do {
    LVar2 = ls->c;
    pcVar5 = (ls->sb).w;
    if (*(int *)&(ls->sb).e == (int)pcVar5) {
      pcVar5 = lj_buf_more2(&ls->sb,1);
    }
    *pcVar5 = (char)LVar2;
    (ls->sb).w = pcVar5 + 1;
    pbVar3 = (byte *)ls->p;
    if (pbVar3 < ls->pe) {
      ls->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    else {
      uVar4 = lex_more(ls);
    }
    uVar6 = uVar6 + 1;
    ls->c = uVar4;
  } while ((uVar4 == 0x3d) && (uVar6 < 0x20000000));
  return uVar6 ^ -(uint)(uVar4 != uVar1);
}

Assistant:

static int lex_skipeq(LexState *ls)
{
  int count = 0;
  LexChar s = ls->c;
  lj_assertLS(s == '[' || s == ']', "bad usage");
  while (lex_savenext(ls) == '=' && count < 0x20000000)
    count++;
  return (ls->c == s) ? count : (-count) - 1;
}